

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall SimpleLogger::LoggerStream::LoggerStream(LoggerStream *this)

{
  undefined8 *in_RDI;
  
  std::ios::ios((ios *)(in_RDI + 0x44));
  *in_RDI = 0x2ca068;
  in_RDI[0x44] = 0x2ca090;
  std::ostream::ostream(in_RDI,(streambuf *)&PTR_construction_vtable_24__002ca0a8);
  *in_RDI = 0x2ca068;
  in_RDI[0x44] = 0x2ca090;
  std::__cxx11::stringbuf::stringbuf((stringbuf *)(in_RDI + 1));
  std::__cxx11::stringstream::stringstream((stringstream *)(in_RDI + 0xe));
  *(undefined4 *)(in_RDI + 0x3f) = 0;
  in_RDI[0x40] = 0;
  in_RDI[0x41] = 0;
  in_RDI[0x42] = 0;
  in_RDI[0x43] = 0;
  return;
}

Assistant:

LoggerStream() : std::ostream(&buf), level(0), logger(nullptr)
                       , file(nullptr), func(nullptr), line(0) {}